

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cylinder.cpp
# Opt level: O2

void __thiscall
geometry::primitive::Cylinder::Cylinder
          (Cylinder *this,Matrix4d *transformation,shared_ptr<material::Material> *material,
          double minimum,double maximum,bool closed)

{
  __shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&material->super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>
            );
  Primitive::Primitive
            (&this->super_Primitive,transformation,(shared_ptr<material::Material> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_transform_00114838;
  this->m_minmax[0] = minimum;
  this->m_minmax[1] = maximum;
  this->m_closed = closed;
  return;
}

Assistant:

geometry::primitive::Cylinder::Cylinder(const math::Matrix4d &transformation, std::shared_ptr<material::Material> material, double minimum, double maximum, bool closed) :
    Primitive(transformation, material),
    m_minmax{minimum, maximum},
    m_closed{closed}
{}